

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::encode_rice(symbol_codec *this,uint v,uint m)

{
  uint num_bits;
  
  for (num_bits = v >> ((byte)m & 0x1f); 0x10 < num_bits; num_bits = num_bits - 0x10) {
    record_put_bits(this,0xffff,0x10);
  }
  if (num_bits != 0) {
    encode_bits(this,~(-1 << ((byte)num_bits & 0x1f)),num_bits);
  }
  record_put_bits(this,0,1);
  encode_bits(this,~(-1 << ((byte)m & 0x1f)) & v,m);
  return;
}

Assistant:

void symbol_codec::encode_rice(uint v, uint m)
    {
        CRNLIB_ASSERT(m > 0);

        uint q = v >> m;
        uint r = v & ((1 << m) - 1);

        while (q > 16)
        {
            encode_bits(0xFFFF, 16);
            q -= 16;
        }

        if (q)
        {
            encode_bits((1 << q) - 1, q);
        }

        encode_bits(0, 1);

        encode_bits(r, m);
    }